

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void encode_superblock(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **t,
                      RUN_TYPE dry_run,BLOCK_SIZE bsize,int *rate)

{
  AV1_COMMON *cm;
  uint *puVar1;
  MACROBLOCKD *xd;
  byte bVar2;
  int mi_row;
  int mi_col;
  MB_MODE_INFO *mi;
  MB_MODE_INFO *pMVar3;
  byte bVar4;
  scale_factors *psVar5;
  RefCntBuffer *pRVar6;
  TX_MODE TVar7;
  char val;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  YV12_BUFFER_CONFIG *src;
  int idy;
  int iVar11;
  scale_factors *psVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint8_t uVar17;
  ulong uVar18;
  int idx;
  uint uVar19;
  int iVar20;
  MB_MODE_INFO **ppMVar21;
  int plane;
  int iVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  int mi_height;
  int mi_width;
  
  uVar17 = ((cpi->common).seq_params)->monochrome;
  ppMVar21 = (td->mb).e_mbd.mi;
  mi = *ppMVar21;
  if ((cpi->common).seg.enabled == '\0') {
    bVar13 = 0;
  }
  else {
    bVar13 = ((byte)(cpi->common).seg.feature_mask[*(ushort *)&mi->field_0xa7 & 7] & 0x40) >> 6;
  }
  bVar24 = true;
  if (-1 < (char)*(ushort *)&mi->field_0xa7) {
    bVar24 = '\0' < mi->ref_frame[0];
  }
  iVar11 = (cpi->common).mi_params.mi_stride;
  bVar9 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  uVar19 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize]
  ;
  iVar14 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
  (td->mb).txfm_search_params.tx_size_search_method =
       (cpi->winner_mode_params).tx_size_search_methods[0];
  if (iVar14 != 0) {
    (td->mb).txfm_search_params.tx_size_search_method =
         (cpi->winner_mode_params).tx_size_search_methods[2];
  }
  cm = &cpi->common;
  iVar14 = (uint)(uVar17 == '\0') * 2 + 1;
  xd = &(td->mb).e_mbd;
  TVar7 = '\x02' - ((td->mb).txfm_search_params.tx_size_search_method == '\x02');
  if ((cpi->common).features.coded_lossless != false) {
    TVar7 = '\0';
  }
  (td->mb).txfm_search_params.tx_mode_search_type = TVar7;
  mi_row = (td->mb).e_mbd.mi_row;
  mi_col = (td->mb).e_mbd.mi_col;
  uVar15 = (uint)bVar9;
  if (bVar24) {
    bVar9 = mi->ref_frame[0];
    bVar2 = mi->ref_frame[1];
    iVar20 = -1;
    iVar22 = -1;
    if ((char)bVar9 < '\t') {
      bVar4 = 1;
      if ('\x01' < (char)bVar9) {
        bVar4 = bVar9;
      }
      iVar22 = (cpi->common).remapped_ref_idx[bVar4 - 1];
    }
    psVar5 = (scale_factors *)0x0;
    if (iVar22 != -1) {
      psVar5 = (cpi->common).ref_scale_factors + iVar22;
    }
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar5;
    if ((char)bVar2 < '\t') {
      bVar9 = 1;
      if ('\x01' < (char)bVar2) {
        bVar9 = bVar2;
      }
      iVar20 = (cpi->common).remapped_ref_idx[bVar9 - 1];
    }
    psVar12 = (scale_factors *)0x0;
    psVar5 = (cpi->common).ref_scale_factors + iVar20;
    if (iVar20 == -1) {
      psVar5 = psVar12;
    }
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar5;
    do {
      iVar22 = -1;
      if ((byte)(mi->ref_frame[(long)psVar12] - 1U) < 8) {
        iVar22 = (cpi->common).remapped_ref_idx[(byte)mi->ref_frame[(long)psVar12] - 1];
      }
      if (iVar22 == -1) {
        pRVar6 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar6 = (cpi->common).ref_frame_map[iVar22];
      }
      src = &pRVar6->buf;
      if (pRVar6 == (RefCntBuffer *)0x0) {
        src = (YV12_BUFFER_CONFIG *)0x0;
      }
      av1_setup_pre_planes
                (xd,(int)psVar12,src,mi_row,mi_col,
                 (td->mb).e_mbd.block_ref_scale_factors[(long)psVar12],iVar14);
    } while ((psVar12 == (scale_factors *)0x0) &&
            (psVar12 = (scale_factors *)0x1, '\0' < (char)bVar2));
    uVar8 = 0;
    if (((td->mb).reuse_inter_pred == true) && ((cpi->sf).rt_sf.nonrd_check_partition_split == 0)) {
      uVar8 = (uint)(((cpi->common).seq_params)->bit_depth == AOM_BITS_8);
    }
    av1_enc_build_inter_predictor
              (cm,xd,mi_row,mi_col,(BUFFER_SET *)0x0,bsize,uVar8,
               (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
    if (mi->motion_mode == '\x01') {
      av1_build_obmc_inter_predictors_sb(cm,xd);
    }
    av1_encode_sb(cpi,&td->mb,bsize,dry_run);
    uVar17 = '\0';
    av1_tokenize_sb_vartx(cpi,td,dry_run,bsize,(int *)0x0,tile_data->allow_update_cdf);
  }
  else {
    if (uVar17 == '\0') {
      uVar8 = 1;
      if ((td->mb).e_mbd.is_chroma_ref == true) {
        pMVar3 = *(td->mb).e_mbd.mi;
        if ((pMVar3->field_0xa7 & 0x80) != 0) goto LAB_001e6f7f;
        uVar8 = 0;
        if (pMVar3->ref_frame[0] < '\x01') {
          uVar8 = (uint)(pMVar3->uv_mode == '\r');
        }
      }
    }
    else {
LAB_001e6f7f:
      uVar8 = 0;
    }
    (td->mb).e_mbd.cfl.store_y = uVar8;
    mi->skip_txfm = '\x01';
    iVar22 = 0;
    do {
      av1_encode_intra_block_plane
                (cpi,&td->mb,bsize,iVar22,dry_run,
                 cpi->optimize_seg_arr[*(ushort *)&mi->field_0xa7 & 7]);
      iVar22 = iVar22 + 1;
    } while (iVar14 != iVar22);
    if ((((cpi->common).seg.segid_preskip == '\0') && ((cpi->common).seg.update_map != '\0')) &&
       ((cpi->enc_seg).has_lossless_segment == true)) {
      mi->skip_txfm = '\0';
    }
    (td->mb).e_mbd.cfl.store_y = 0;
    if (((cpi->common).features.allow_screen_content_tools != false) &&
       ((BLOCK_128X128 < bsize || ((0xe007U >> (bsize & 0x1f) & 1) == 0)))) {
      lVar23 = 0;
      do {
        if ((dry_run == '\0') && ((mi->palette_mode_info).palette_size[lVar23] != '\0')) {
          av1_tokenize_color_map
                    (&td->mb,(int)lVar23,t,bsize,mi->tx_size,'\0',(uint)tile_data->allow_update_cdf,
                     td->counts);
        }
      } while ((uVar17 == '\0') && (bVar25 = lVar23 == 0, lVar23 = lVar23 + 1, bVar25));
    }
    uVar17 = tile_data->allow_update_cdf;
    av1_update_intra_mb_txb_context(cpi,td,dry_run,bsize,uVar17);
  }
  if (dry_run != '\0') goto LAB_001e7292;
  if ((((((cm->current_frame).frame_type & 0xfd) == 0) &&
       ((cpi->common).features.allow_screen_content_tools == true)) &&
      ((cpi->common).features.allow_intrabc != false)) && ((mi->field_0xa7 & 0x80) != 0)) {
    td->intrabc_used = 1;
  }
  uVar16 = (ulong)(td->mb).txfm_search_params.tx_mode_search_type;
  if (((uVar16 == 2) && ((td->mb).e_mbd.lossless[*(ushort *)&mi->field_0xa7 & 7] == 0)) &&
     (mi->bsize != BLOCK_4X4)) {
    if (!bVar24) {
      bVar9 = mi->tx_size;
      bVar2 = ""[bsize];
      if (bVar9 != bVar2) {
        puVar1 = &(td->mb).txfm_search_info.txb_split_count;
        *puVar1 = *puVar1 + 1;
      }
      if (bsize != BLOCK_4X4) {
        uVar8 = get_tx_size_context(xd);
        val = '\0';
        for (; bVar9 != bVar2; bVar2 = ""[bVar2]) {
          val = val + '\x01';
        }
        if (tile_data->allow_update_cdf != '\0') {
          update_cdf(((td->mb).e_mbd.tile_ctx)->tx_size_cdf
                     [(ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] - 1]
                     [uVar8],val,(byte)bsize_to_max_depth_bsize_to_max_depth_table[bsize] + 1);
        }
      }
      goto LAB_001e7292;
    }
    if (mi->skip_txfm == '\0' && bVar13 == 0) {
      tx_partition_count_update
                (cm,&td->mb,bsize,(FRAME_COUNTS *)(ulong)tile_data->allow_update_cdf,uVar17);
      goto LAB_001e7292;
    }
  }
  if (bVar24) {
    if ((td->mb).e_mbd.lossless[*(ushort *)&mi->field_0xa7 & 7] == 0) {
      bVar9 = ""[uVar16];
      if (bsize == BLOCK_4X4) {
        if (""[bsize] < bVar9) {
          bVar9 = ""[bsize];
        }
      }
      else if (""[""[bsize]] <= bVar9) {
        bVar9 = ""[bsize];
      }
    }
    else {
      bVar9 = 0;
    }
  }
  else {
    bVar9 = mi->tx_size;
  }
  uVar8 = (cpi->common).mi_params.mi_cols - mi_col;
  if ((int)uVar15 <= (int)uVar8) {
    uVar8 = uVar15;
  }
  uVar10 = (cpi->common).mi_params.mi_rows - mi_row;
  if ((int)uVar19 <= (int)uVar10) {
    uVar10 = uVar19;
  }
  if (0 < (int)uVar10) {
    uVar16 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar18 = 0;
        do {
          ppMVar21[uVar18]->tx_size = bVar9;
          uVar18 = uVar18 + 1;
        } while (uVar8 != uVar18);
      }
      uVar16 = uVar16 + 1;
      ppMVar21 = ppMVar21 + iVar11;
    } while (uVar16 != uVar10);
  }
  if (bVar9 != ""[bsize]) {
    puVar1 = &(td->mb).txfm_search_info.txb_split_count;
    *puVar1 = *puVar1 + 1;
  }
LAB_001e7292:
  uVar16 = (ulong)(td->mb).txfm_search_params.tx_mode_search_type;
  if (((uVar16 == 2) && (bVar24 && mi->bsize != BLOCK_4X4)) &&
     ((mi->skip_txfm == '\0' && bVar13 == 0 &&
      ((td->mb).e_mbd.lossless[*(ushort *)&mi->field_0xa7 & 7] == 0)))) {
    if (dry_run != '\0') {
      iVar11 = 0;
      uVar8 = 0;
      if ((td->mb).e_mbd.lossless[*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7] == 0) {
        uVar8 = (uint)""[bsize];
      }
      iVar14 = *(int *)((long)tx_size_high_unit + (ulong)(uVar8 << 2));
      iVar22 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar8 << 2));
      (td->mb).e_mbd.above_txfm_context =
           (cpi->common).above_contexts.txfm[(td->mb).e_mbd.tile.tile_row] + (td->mb).e_mbd.mi_col;
      (td->mb).e_mbd.left_txfm_context =
           (td->mb).e_mbd.left_txfm_context_buffer + ((td->mb).e_mbd.mi_row & 0x1f);
      do {
        iVar20 = 0;
        do {
          set_txfm_context(xd,(TX_SIZE)uVar8,iVar11,iVar20);
          iVar20 = iVar20 + iVar22;
        } while (iVar20 < (int)uVar15);
        iVar11 = iVar11 + iVar14;
      } while (iVar11 < (int)uVar19);
    }
  }
  else {
    if (bVar24) {
      if ((td->mb).e_mbd.lossless[*(ushort *)&mi->field_0xa7 & 7] == 0) {
        bVar9 = ""[uVar16];
        if (bsize == BLOCK_4X4) {
          if (""[bsize] < bVar9) {
            bVar9 = ""[bsize];
          }
        }
        else if (""[""[bsize]] <= bVar9) {
          bVar9 = ""[bsize];
        }
      }
      else {
        bVar9 = 0;
      }
    }
    else {
      bVar9 = mi->tx_size;
      if (bsize == BLOCK_4X4) {
        bVar9 = 0;
      }
    }
    mi->tx_size = bVar9;
    bVar2 = (td->mb).e_mbd.width;
    bVar4 = (td->mb).e_mbd.height;
    bVar24 = true;
    if (mi->skip_txfm != '\0' || bVar13 != 0) {
      if ((mi->field_0xa7 & 0x80) == 0) {
        bVar24 = mi->ref_frame[0] < '\x01';
      }
      else {
        bVar24 = false;
      }
    }
    if (bVar24) {
      uVar19 = tx_size_high[bVar9];
    }
    else {
      uVar19 = (uint)bVar4 * 4 & 0xff;
    }
    if ((ulong)bVar2 != 0) {
      if (bVar24) {
        uVar15 = tx_size_wide[bVar9];
      }
      else {
        uVar15 = (uint)bVar2 * 4 & 0xff;
      }
      memset((td->mb).e_mbd.above_txfm_context,uVar15,(ulong)bVar2);
    }
    if ((ulong)bVar4 != 0) {
      memset((td->mb).e_mbd.left_txfm_context,uVar19 & 0xff,(ulong)bVar4);
    }
  }
  if ((((mi->field_0xa7 & 0x80) != 0) || ('\0' < mi->ref_frame[0])) &&
     ((td->mb).e_mbd.is_chroma_ref == false)) {
    pMVar3 = *(td->mb).e_mbd.mi;
    uVar16 = (ulong)pMVar3->bsize;
    if ((td->mb).e_mbd.lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
      bVar24 = (0x2f0bffUL >> (uVar16 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar16 & 0x3f) & 1) == 0) {
        bVar24 = false;
      }
    }
    else {
      bVar24 = av1_ss_size_lookup[uVar16][(td->mb).e_mbd.plane[1].subsampling_x]
               [(td->mb).e_mbd.plane[1].subsampling_y] == BLOCK_4X4;
    }
    if (bVar24) {
      cfl_store_block(xd,mi->bsize,mi->tx_size);
    }
  }
  if (((dry_run == '\0') && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
     ((((cpi->svc).temporal_layer_id == 0 && ((cpi->sf).rt_sf.use_temporal_noise_estimate != 0)) &&
      ((cpi->ppi->use_svc == 0 ||
       ((((cpi->svc).layer_context)->is_key_frame == 0 &&
        ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))))))) {
    update_zeromv_cnt(cpi,mi,mi_row,mi_col,bsize);
    return;
  }
  return;
}

Assistant:

static void encode_superblock(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                              ThreadData *td, TokenExtra **t, RUN_TYPE dry_run,
                              BLOCK_SIZE bsize, int *rate) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO **mi_4x4 = xd->mi;
  MB_MODE_INFO *mbmi = mi_4x4[0];
  const int seg_skip =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP);
  const int mis = cm->mi_params.mi_stride;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  const int is_inter = is_inter_block(mbmi);

  // Initialize tx_mode and tx_size_search_method
  TxfmSearchParams *txfm_params = &x->txfm_search_params;
  set_tx_size_search_method(
      cm, &cpi->winner_mode_params, txfm_params,
      cpi->sf.winner_mode_sf.enable_winner_mode_for_tx_size_srch, 1);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  if (!is_inter) {
    xd->cfl.store_y = store_cfl_required(cm, xd);
    mbmi->skip_txfm = 1;
    for (int plane = 0; plane < num_planes; ++plane) {
      av1_encode_intra_block_plane(cpi, x, bsize, plane, dry_run,
                                   cpi->optimize_seg_arr[mbmi->segment_id]);
    }

    // If there is at least one lossless segment, force the skip for intra
    // block to be 0, in order to avoid the segment_id to be changed by in
    // write_segment_id().
    if (!cpi->common.seg.segid_preskip && cpi->common.seg.update_map &&
        cpi->enc_seg.has_lossless_segment)
      mbmi->skip_txfm = 0;

    xd->cfl.store_y = 0;
    if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
      for (int plane = 0; plane < AOMMIN(2, num_planes); ++plane) {
        if (mbmi->palette_mode_info.palette_size[plane] > 0) {
          if (!dry_run) {
            av1_tokenize_color_map(x, plane, t, bsize, mbmi->tx_size,
                                   PALETTE_MAP, tile_data->allow_update_cdf,
                                   td->counts);
          } else if (dry_run == DRY_RUN_COSTCOEFFS) {
            *rate +=
                av1_cost_color_map(x, plane, bsize, mbmi->tx_size, PALETTE_MAP);
          }
        }
      }
    }

    av1_update_intra_mb_txb_context(cpi, td, dry_run, bsize,
                                    tile_data->allow_update_cdf);
  } else {
    int ref;
    const int is_compound = has_second_ref(mbmi);

    set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    for (ref = 0; ref < 1 + is_compound; ++ref) {
      const YV12_BUFFER_CONFIG *cfg =
          get_ref_frame_yv12_buf(cm, mbmi->ref_frame[ref]);
      assert(IMPLIES(!is_intrabc_block(mbmi), cfg));
      av1_setup_pre_planes(xd, ref, cfg, mi_row, mi_col,
                           xd->block_ref_scale_factors[ref], num_planes);
    }
    // Predicted sample of inter mode (for Luma plane) cannot be reused if
    // nonrd_check_partition_split speed feature is enabled, Since in such cases
    // the buffer may not contain the predicted sample of best mode.
    const int start_plane =
        (x->reuse_inter_pred && (!cpi->sf.rt_sf.nonrd_check_partition_split) &&
         cm->seq_params->bit_depth == AOM_BITS_8)
            ? 1
            : 0;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  start_plane, av1_num_planes(cm) - 1);
    if (mbmi->motion_mode == OBMC_CAUSAL) {
      assert(cpi->oxcf.motion_mode_cfg.enable_obmc);
      av1_build_obmc_inter_predictors_sb(cm, xd);
    }

#if CONFIG_MISMATCH_DEBUG
    if (dry_run == OUTPUT_ENABLED) {
      for (int plane = 0; plane < num_planes; ++plane) {
        const struct macroblockd_plane *pd = &xd->plane[plane];
        int pixel_c, pixel_r;
        mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, 0, 0,
                        pd->subsampling_x, pd->subsampling_y);
        if (!is_chroma_reference(mi_row, mi_col, bsize, pd->subsampling_x,
                                 pd->subsampling_y))
          continue;
        mismatch_record_block_pre(pd->dst.buf, pd->dst.stride,
                                  cm->current_frame.order_hint, plane, pixel_c,
                                  pixel_r, pd->width, pd->height,
                                  xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
      }
    }
#else
    (void)num_planes;
#endif

    av1_encode_sb(cpi, x, bsize, dry_run);
    av1_tokenize_sb_vartx(cpi, td, dry_run, bsize, rate,
                          tile_data->allow_update_cdf);
  }

  if (!dry_run) {
    if (av1_allow_intrabc(cm) && is_intrabc_block(mbmi)) td->intrabc_used = 1;
    if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
        !xd->lossless[mbmi->segment_id] && mbmi->bsize > BLOCK_4X4 &&
        !(is_inter && (mbmi->skip_txfm || seg_skip))) {
      if (is_inter) {
        tx_partition_count_update(cm, x, bsize, td->counts,
                                  tile_data->allow_update_cdf);
      } else {
        if (mbmi->tx_size != max_txsize_rect_lookup[bsize])
          ++x->txfm_search_info.txb_split_count;
        if (block_signals_txsize(bsize)) {
          const int tx_size_ctx = get_tx_size_context(xd);
          const int32_t tx_size_cat = bsize_to_tx_size_cat(bsize);
          const int depth = tx_size_to_depth(mbmi->tx_size, bsize);
          const int max_depths = bsize_to_max_depth(bsize);

          if (tile_data->allow_update_cdf)
            update_cdf(xd->tile_ctx->tx_size_cdf[tx_size_cat][tx_size_ctx],
                       depth, max_depths + 1);
#if CONFIG_ENTROPY_STATS
          ++td->counts->intra_tx_size[tx_size_cat][tx_size_ctx][depth];
#endif
        }
      }
      assert(IMPLIES(is_rect_tx(mbmi->tx_size), is_rect_tx_allowed(xd, mbmi)));
    } else {
      int i, j;
      TX_SIZE intra_tx_size;
      // The new intra coding scheme requires no change of transform size
      if (is_inter) {
        if (xd->lossless[mbmi->segment_id]) {
          intra_tx_size = TX_4X4;
        } else {
          intra_tx_size =
              tx_size_from_tx_mode(bsize, txfm_params->tx_mode_search_type);
        }
      } else {
        intra_tx_size = mbmi->tx_size;
      }

      const int cols = AOMMIN(cm->mi_params.mi_cols - mi_col, mi_width);
      const int rows = AOMMIN(cm->mi_params.mi_rows - mi_row, mi_height);
      for (j = 0; j < rows; j++) {
        for (i = 0; i < cols; i++) mi_4x4[mis * j + i]->tx_size = intra_tx_size;
      }

      if (intra_tx_size != max_txsize_rect_lookup[bsize])
        ++x->txfm_search_info.txb_split_count;
    }
  }

  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
      block_signals_txsize(mbmi->bsize) && is_inter &&
      !(mbmi->skip_txfm || seg_skip) && !xd->lossless[mbmi->segment_id]) {
    if (dry_run) tx_partition_set_contexts(cm, xd, bsize);
  } else {
    TX_SIZE tx_size = mbmi->tx_size;
    // The new intra coding scheme requires no change of transform size
    if (is_inter) {
      if (xd->lossless[mbmi->segment_id]) {
        tx_size = TX_4X4;
      } else {
        tx_size = tx_size_from_tx_mode(bsize, txfm_params->tx_mode_search_type);
      }
    } else {
      tx_size = (bsize > BLOCK_4X4) ? tx_size : TX_4X4;
    }
    mbmi->tx_size = tx_size;
    set_txfm_ctxs(tx_size, xd->width, xd->height,
                  (mbmi->skip_txfm || seg_skip) && is_inter_block(mbmi), xd);
  }

#if !CONFIG_REALTIME_ONLY
  if (is_inter_block(mbmi) && !xd->is_chroma_ref && is_cfl_allowed(xd)) {
    cfl_store_block(xd, mbmi->bsize, mbmi->tx_size);
  }
#endif
  if (!dry_run) {
    if (cpi->oxcf.pass == AOM_RC_ONE_PASS && cpi->svc.temporal_layer_id == 0 &&
        cpi->sf.rt_sf.use_temporal_noise_estimate &&
        (!cpi->ppi->use_svc ||
         (cpi->ppi->use_svc &&
          !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame &&
          cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1)))
      update_zeromv_cnt(cpi, mbmi, mi_row, mi_col, bsize);
  }
}